

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O3

uint8_t ** __thiscall
Inter_Symbol_Generator::identity_matrix_generate
          (Inter_Symbol_Generator *this,uint32_t row,uint32_t col)

{
  uint8_t **ppuVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (row == col) {
    ppuVar1 = new_matrix(this,row,row);
    if (row != 0) {
      uVar2 = 0;
      do {
        uVar3 = 0;
        do {
          if (uVar2 == uVar3) {
            ppuVar1[uVar2][uVar2] = '\x01';
          }
          uVar3 = uVar3 + 1;
        } while (row != uVar3);
        uVar2 = uVar2 + 1;
      } while (uVar2 != row);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"row is not equal to col!",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    ppuVar1 = (uint8_t **)0x0;
  }
  return ppuVar1;
}

Assistant:

uint8_t** Inter_Symbol_Generator::identity_matrix_generate(uint32_t row, uint32_t col)
{
	uint8_t **matrix;

	if (row != col)
	{
		std::cerr << "row is not equal to col!" << std::endl;
		return NULL;
	}


	matrix = new_matrix(row, col);

	for (int i = 0; i < row; i++)
	{
		for (int j = 0; j < col; j++)
		{
			if (i == j)
			{
				matrix[i][j] = 1;
			}
			
		}
	}

	return matrix;
}